

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
SharedPtr(SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
          *this,TopLevelObject *ptr)

{
  TopLevelObject *pTVar1;
  SharedPtrState<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>
  *pSVar2;
  DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
  local_25 [13];
  TopLevelObject *local_18;
  TopLevelObject *ptr_local;
  SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
  *this_local;
  
  this->m_ptr = (TopLevelObject *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (TopLevelObject *)this;
  pSVar2 = (SharedPtrState<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>
            *)operator_new(0x20);
  pTVar1 = local_18;
  DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
  ::DefaultDeleter(local_25);
  SharedPtrState<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>
  ::SharedPtrState(pSVar2,pTVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}